

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containersNative.cpp
# Opt level: O0

PackageInfo * chatra::emb::containers::packageInfo(void)

{
  allocator<chatra::Script> *this;
  initializer_list<chatra::NativeCallHandlerInfo> __l;
  initializer_list<chatra::Script> __l_00;
  undefined *puVar1;
  PackageInfo *in_RDI;
  NativeCallHandlerInfo *local_730;
  Script *local_670;
  shared_ptr<chatra::emb::containers::ContainersPackageInterface> local_628;
  allocator<chatra::NativeCallHandlerInfo> local_613;
  undefined1 local_612;
  allocator local_611;
  string local_610;
  allocator local_5e9;
  string local_5e8;
  allocator local_5c1;
  string local_5c0;
  allocator local_599;
  string local_598;
  allocator local_571;
  string local_570;
  allocator local_549;
  string local_548;
  allocator local_521;
  string local_520;
  allocator local_4f9;
  string local_4f8;
  allocator local_4d1;
  string local_4d0;
  allocator local_4a9;
  string local_4a8;
  allocator local_481;
  string local_480;
  allocator local_459;
  string local_458;
  allocator local_431;
  string local_430;
  allocator local_409;
  string local_408;
  NativeCallHandlerInfo *local_3e8;
  NativeCallHandlerInfo local_3e0;
  NativeCallHandlerInfo local_378;
  NativeCallHandlerInfo local_310;
  NativeCallHandlerInfo local_2a8;
  NativeCallHandlerInfo local_240;
  NativeCallHandlerInfo local_1d8;
  NativeCallHandlerInfo local_170;
  undefined1 local_108 [24];
  vector<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_> handlers;
  string local_d8;
  allocator local_a1;
  string local_a0;
  Script *local_80;
  Script local_78;
  Script *local_38;
  size_type local_30;
  undefined1 local_28 [8];
  vector<chatra::Script,_std::allocator<chatra::Script>_> scripts;
  
  handlers.
  super__Vector_base<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
  local_80 = &local_78;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a0,"containers",&local_a1);
  puVar1 = script;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_d8,puVar1,
             (allocator *)
             ((long)&handlers.
                     super__Vector_base<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  Script::Script(&local_78,&local_a0,&local_d8);
  handlers.
  super__Vector_base<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
  local_30 = 1;
  this = (allocator<chatra::Script> *)
         ((long)&handlers.
                 super__Vector_base<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage + 5);
  local_38 = &local_78;
  std::allocator<chatra::Script>::allocator(this);
  __l_00._M_len = local_30;
  __l_00._M_array = local_38;
  std::vector<chatra::Script,_std::allocator<chatra::Script>_>::vector
            ((vector<chatra::Script,_std::allocator<chatra::Script>_> *)local_28,__l_00,this);
  std::allocator<chatra::Script>::~allocator
            ((allocator<chatra::Script> *)
             ((long)&handlers.
                     super__Vector_base<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 5));
  local_670 = (Script *)&local_38;
  do {
    local_670 = local_670 + -1;
    Script::~Script(local_670);
  } while (local_670 != &local_78);
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&handlers.
                     super__Vector_base<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  local_612 = 1;
  local_3e8 = &local_3e0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_408,"ByteArray",&local_409);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_430,"_init_instance",&local_431);
  NativeCallHandlerInfo::NativeCallHandlerInfo
            (&local_3e0,byteArray_initInstance,&local_408,&local_430);
  local_3e8 = &local_378;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_458,"ByteArray",&local_459);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_480,"size",&local_481);
  NativeCallHandlerInfo::NativeCallHandlerInfo(&local_378,byteArray_size,&local_458,&local_480);
  local_3e8 = &local_310;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_4a8,"ByteArray",&local_4a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_4d0,"_native_resize",&local_4d1);
  NativeCallHandlerInfo::NativeCallHandlerInfo(&local_310,byteArray_resize,&local_4a8,&local_4d0);
  local_3e8 = &local_2a8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_4f8,"ByteArray",&local_4f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_520,"_native_add",&local_521);
  NativeCallHandlerInfo::NativeCallHandlerInfo(&local_2a8,byteArray_add,&local_4f8,&local_520);
  local_3e8 = &local_240;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_548,"ByteArray",&local_549);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_570,"_native_insert",&local_571);
  NativeCallHandlerInfo::NativeCallHandlerInfo(&local_240,byteArray_insert,&local_548,&local_570);
  local_3e8 = &local_1d8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_598,"ByteArray",&local_599);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_5c0,"_native_at",&local_5c1);
  NativeCallHandlerInfo::NativeCallHandlerInfo(&local_1d8,byteArray_at,&local_598,&local_5c0);
  local_3e8 = &local_170;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_5e8,"ByteArray",&local_5e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_610,"remove",&local_611);
  NativeCallHandlerInfo::NativeCallHandlerInfo(&local_170,byteArray_remove,&local_5e8,&local_610);
  local_612 = 0;
  local_108._0_8_ = &local_3e0;
  local_108._8_8_ = 7;
  std::allocator<chatra::NativeCallHandlerInfo>::allocator(&local_613);
  __l._M_len = local_108._8_8_;
  __l._M_array = (iterator)local_108._0_8_;
  std::vector<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>::vector
            ((vector<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>
              *)(local_108 + 0x10),__l,&local_613);
  std::allocator<chatra::NativeCallHandlerInfo>::~allocator(&local_613);
  local_730 = (NativeCallHandlerInfo *)local_108;
  do {
    local_730 = local_730 + -1;
    NativeCallHandlerInfo::~NativeCallHandlerInfo(local_730);
  } while (local_730 != &local_3e0);
  std::__cxx11::string::~string((string *)&local_610);
  std::allocator<char>::~allocator((allocator<char> *)&local_611);
  std::__cxx11::string::~string((string *)&local_5e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_5e9);
  std::__cxx11::string::~string((string *)&local_5c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_5c1);
  std::__cxx11::string::~string((string *)&local_598);
  std::allocator<char>::~allocator((allocator<char> *)&local_599);
  std::__cxx11::string::~string((string *)&local_570);
  std::allocator<char>::~allocator((allocator<char> *)&local_571);
  std::__cxx11::string::~string((string *)&local_548);
  std::allocator<char>::~allocator((allocator<char> *)&local_549);
  std::__cxx11::string::~string((string *)&local_520);
  std::allocator<char>::~allocator((allocator<char> *)&local_521);
  std::__cxx11::string::~string((string *)&local_4f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_4f9);
  std::__cxx11::string::~string((string *)&local_4d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4d1);
  std::__cxx11::string::~string((string *)&local_4a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_4a9);
  std::__cxx11::string::~string((string *)&local_480);
  std::allocator<char>::~allocator((allocator<char> *)&local_481);
  std::__cxx11::string::~string((string *)&local_458);
  std::allocator<char>::~allocator((allocator<char> *)&local_459);
  std::__cxx11::string::~string((string *)&local_430);
  std::allocator<char>::~allocator((allocator<char> *)&local_431);
  std::__cxx11::string::~string((string *)&local_408);
  std::allocator<char>::~allocator((allocator<char> *)&local_409);
  std::vector<chatra::Script,_std::allocator<chatra::Script>_>::vector
            (&in_RDI->scripts,(vector<chatra::Script,_std::allocator<chatra::Script>_> *)local_28);
  std::vector<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>::vector
            (&in_RDI->handlers,
             (vector<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>
              *)(local_108 + 0x10));
  std::make_shared<chatra::emb::containers::ContainersPackageInterface>();
  std::shared_ptr<chatra::IPackage>::
  shared_ptr<chatra::emb::containers::ContainersPackageInterface,void>
            (&in_RDI->interface,&local_628);
  std::shared_ptr<chatra::emb::containers::ContainersPackageInterface>::~shared_ptr(&local_628);
  std::vector<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>::
  ~vector((vector<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_> *)
          (local_108 + 0x10));
  std::vector<chatra::Script,_std::allocator<chatra::Script>_>::~vector
            ((vector<chatra::Script,_std::allocator<chatra::Script>_> *)local_28);
  return in_RDI;
}

Assistant:

PackageInfo packageInfo() {
	std::vector<Script> scripts = {{"containers", script}};
	std::vector<HandlerInfo> handlers = {
			{byteArray_initInstance, "ByteArray", "_init_instance"},
			{byteArray_size, "ByteArray", "size"},
			{byteArray_resize, "ByteArray", "_native_resize"},
			{byteArray_add, "ByteArray", "_native_add"},
			{byteArray_insert, "ByteArray", "_native_insert"},
			{byteArray_at, "ByteArray", "_native_at"},
			{byteArray_remove, "ByteArray", "remove"},
	};
	return {scripts, handlers, std::make_shared<ContainersPackageInterface>()};
}